

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Int_t * Lms_GiaCountTruths(Lms_Man_t *p)

{
  int i;
  Vec_Int_t *p_00;
  int Addition;
  int i_00;
  
  p_00 = Vec_IntStart(p->vTtMem->nEntries);
  for (i_00 = 0; i_00 < p->vTruthIds->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(p->vTruthIds,i_00);
    if (-1 < i) {
      Vec_IntAddToEntry(p_00,i,Addition);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Lms_GiaCountTruths( Lms_Man_t * p )
{
    Vec_Int_t * vCounts = Vec_IntStart( Vec_MemEntryNum(p->vTtMem) );
    int i, Entry;
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Entry >= 0 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    return vCounts;
}